

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfCase.cpp
# Opt level: O3

string * __thiscall
ninx::parser::element::IfCase::dump_abi_cxx11_
          (string *__return_storage_ptr__,IfCase *this,int level)

{
  Expression *pEVar1;
  Block *pBVar2;
  string *psVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  stringstream s;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200 [2];
  long local_1f0 [2];
  string *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct((ulong)local_200,(char)level);
  local_1e0 = __return_storage_ptr__;
  plVar4 = (long *)std::__cxx11::string::append((char *)local_200);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_210 = *plVar6;
    lStack_208 = plVar4[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *plVar6;
    local_220 = (long *)*plVar4;
  }
  local_218 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_220,local_218)
  ;
  pEVar1 = (this->condition)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pEVar1->super_Statement).super_ASTElement + 0x18))
            (&local_1d8,pEVar1,level + 1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," {",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  pBVar2 = (this->body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pBVar2->super_Expression).super_Statement + 0x18))
            (&local_220,pBVar2,level + 1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_220,local_218)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct((ulong)local_200,(char)level);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_200);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_210 = *plVar6;
    lStack_208 = plVar4[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *plVar6;
    local_220 = (long *)*plVar4;
  }
  local_218 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_220,local_218)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  psVar3 = local_1e0;
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string ninx::parser::element::IfCase::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "IfCase " << this->condition->dump(level+1) << " {" << std::endl;
    s << body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}